

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

int __thiscall
GEO::geofile::import_mesh_spacing
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector)

{
  int iVar1;
  pointer pcVar2;
  long *__nptr;
  bool bVar3;
  size_type sVar4;
  int *piVar5;
  undefined8 uVar6;
  char *pcVar7;
  pointer pbVar8;
  double dVar9;
  string msh_spc;
  long *local_58;
  char *pcStack_50;
  long local_48 [2];
  long *local_38;
  
  pbVar8 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (long *)0x174069;
  pcStack_50 = "";
  sVar4 = pbVar8[1]._M_string_length;
  if (sVar4 != 0) {
    pcVar7 = pbVar8[1]._M_dataplus._M_p;
    do {
      if (*pcVar7 == ';') {
        boost::algorithm::detail::
        find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::empty_formatF<char>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::empty_container<char>>
                  (pbVar8 + 1,pcVar7,pcVar7 + 1);
        pbVar8 = (split_string_vector->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        break;
      }
      pcVar7 = pcVar7 + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  bVar3 = is_e_notation(pbVar8 + 1);
  if (!bVar3) {
    return 1;
  }
  pcVar2 = pbVar8[1]._M_dataplus._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + pbVar8[1]._M_string_length);
  __nptr = local_58;
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  *piVar5 = 0;
  dVar9 = strtod((char *)__nptr,(char **)&local_38);
  if (local_38 == __nptr) {
    uVar6 = std::__throw_invalid_argument("stod");
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    _Unwind_Resume(uVar6);
  }
  if (*piVar5 != 0) {
    if (*piVar5 != 0x22) goto LAB_0012d0a7;
    dVar9 = (double)std::__throw_out_of_range("stod");
  }
  *piVar5 = iVar1;
LAB_0012d0a7:
  this->mesh_spacing = dVar9;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return 0;
}

Assistant:

int GEO::geofile::import_mesh_spacing(std::vector<std::string> &split_string_vector)
{
    boost::erase_all(split_string_vector[1], ";");
    if (is_e_notation(split_string_vector[1]))
    {
        std::string msh_spc = split_string_vector[1];
        mesh_spacing = std::stod(msh_spc);
        return EXIT_SUCCESS;
    }
    else
        return EXIT_FAILURE;
}